

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O3

ssize_t __thiscall amrex::FABio_ascii::read(FABio_ascii *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ssize_t extraout_RAX;
  long lVar6;
  undefined4 in_register_00000034;
  istream *is;
  IntVect q;
  char local_51;
  IntVect local_50;
  int local_40;
  IntVect local_3c;
  
  is = (istream *)CONCAT44(in_register_00000034,__fd);
  local_40 = *(int *)((long)__buf + 0x24);
  iVar1 = *(int *)((long)__buf + 0x28);
  iVar2 = *(int *)((long)__buf + 0x2c);
  local_3c.vect[0] = 0;
  local_3c.vect[1] = 0;
  local_3c.vect[2] = 0;
  local_50.vect._0_8_ = *(undefined8 *)((long)__buf + 0x18);
  local_50.vect[2] = *(int *)((long)__buf + 0x20);
  if (local_50.vect[2] <= iVar2) {
    do {
      if (iVar2 == local_50.vect[2]) {
        if ((iVar1 < local_50.vect[1]) ||
           ((iVar1 == local_50.vect[1] && (local_40 < local_50.vect[0])))) break;
      }
      amrex::operator>>(is,&local_3c);
      if (local_50.vect[0] == local_3c.vect[0]) {
        if ((local_50.vect[1] != local_3c.vect[1]) || (local_50.vect[2] != local_3c.vect[2]))
        goto LAB_0045fa91;
      }
      else {
LAB_0045fa91:
        poVar5 = ErrorStream();
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Error: read IntVect ",0x14);
        poVar5 = amrex::operator<<(poVar5,&local_3c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  should be ",0xc);
        poVar5 = amrex::operator<<(poVar5,&local_50);
        local_51 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_51,1);
        Error_host("FABio_ascii::read() bad IntVect");
      }
      if (0 < *(int *)((long)__buf + 0x34)) {
        lVar6 = 0;
        do {
          std::istream::_M_extract<double>((double *)is);
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)((long)__buf + 0x34));
      }
      iVar3 = local_50.vect[0];
      iVar4 = local_50.vect[1];
      local_50.vect[0] = local_50.vect[0] + 1;
      if (*(int *)((long)__buf + 0x24) <= iVar3) {
        local_50.vect[1] = local_50.vect[1] + 1;
        local_50.vect[0] = *(int *)((long)__buf + 0x18);
        if (*(int *)((long)__buf + 0x28) <= iVar4) {
          local_50.vect[1] = *(int *)((long)__buf + 0x1c);
          local_50.vect[2] = local_50.vect[2] + 1;
        }
      }
    } while (local_50.vect[2] <= iVar2);
  }
  lVar6 = *(long *)(*(long *)is + -0x18);
  if (((byte)is[lVar6 + 0x20] & 5) != 0) {
    Error_host("FABio_ascii::read() failed");
    lVar6 = extraout_RAX;
  }
  return lVar6;
}

Assistant:

void
FABio_ascii::read (std::istream& is,
                   FArrayBox&    f) const
{
    const Box& bx = f.box();

    IntVect sm = bx.smallEnd();
    IntVect bg = bx.bigEnd();
    IntVect p, q;
    for(p = sm; p <= bg; bx.next(p)) {
        is >> q;
        if(p != q) {
          amrex::ErrorStream() << "Error: read IntVect "
                    << q
                    << "  should be "
                    << p
                    << '\n';
          amrex::Error("FABio_ascii::read() bad IntVect");
        }
        for(int k(0); k < f.nComp(); ++k) {
            is >> f(p, k);
        }
    }

    if(is.fail()) {
        amrex::Error("FABio_ascii::read() failed");
    }
}